

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON * chaiscript::json::JSONParser::parse_number
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  byte __c;
  char cVar1;
  char __rhs;
  type_conflict1 tVar2;
  bool bVar3;
  __index_type _Var4;
  int iVar5;
  undefined1 *puVar6;
  long lVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  int iVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  chaiscript *pcVar14;
  size_type sVar15;
  undefined1 *puVar16;
  double dVar17;
  double dVar18;
  string_view t_str;
  string val;
  string exp_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_type *local_90;
  size_type local_88;
  size_type local_80;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  puVar16 = (undefined1 *)*offset;
  puVar6 = (undefined1 *)str->_M_string_length;
  iVar12 = 1;
  if ((puVar16 < puVar6) && (puVar16[(long)(str->_M_dataplus)._M_p] == '-')) {
    puVar16 = puVar16 + 1;
    *offset = (size_t)puVar16;
    puVar6 = (undefined1 *)str->_M_string_length;
    iVar12 = -1;
  }
  if (puVar16 < puVar6) {
    bVar3 = false;
    do {
      puVar6 = puVar16 + 1;
      *offset = (size_t)puVar6;
      _Var13._M_p = (pointer)str->_M_string_length;
      if (_Var13._M_p <= puVar16) goto LAB_00350137;
      __c = puVar16[(long)(str->_M_dataplus)._M_p];
      if ((byte)(__c - 0x30) < 10) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_b0,__c);
      }
      else {
        puVar16 = puVar6;
        if (__c != 0x2e) break;
        if (bVar3) {
          dVar17 = 0.0;
          if (_Var13._M_p <= puVar6) goto LAB_0034ff21;
          goto LAB_0034fe08;
        }
        bVar3 = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_b0,'.');
      }
      puVar16 = (undefined1 *)*offset;
      _Var13._M_p = (pointer)str->_M_string_length;
    } while (puVar16 < _Var13._M_p);
    if (((__c & 0xdf) == 0x45) && (puVar16 < _Var13._M_p)) {
      *offset = (size_t)(puVar16 + 1);
      _Var13._M_p = (pointer)str->_M_string_length;
      if (_Var13._M_p <= puVar16) {
LAB_00350137:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar16);
      }
      cVar1 = puVar16[(long)(str->_M_dataplus)._M_p];
      if ((cVar1 != '+') && (cVar1 != '-')) {
        *offset = (size_t)puVar16;
      }
      while (puVar16 = (undefined1 *)*offset, puVar16 < (undefined1 *)str->_M_string_length) {
        puVar6 = puVar16 + 1;
        *offset = (size_t)puVar6;
        if ((undefined1 *)str->_M_string_length <= puVar16) goto LAB_00350137;
        __rhs = puVar16[(long)(str->_M_dataplus)._M_p];
        if (9 < (byte)(__rhs - 0x30U)) {
          iVar5 = isspace((int)__rhs);
          _Var13._M_p = (pointer)extraout_RDX_01;
          puVar16 = puVar6;
          if (((iVar5 == 0) && (__rhs != ',')) && ((__rhs != ']' && (__rhs != '}')))) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,
                       "JSON ERROR: Number: Expected a number for exponent, found \'","");
            std::operator+(&local_50,&local_d0,__rhs);
            pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"\'");
            local_90 = (size_type *)(pbVar9->_M_dataplus)._M_p;
            paVar10 = &pbVar9->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90 == paVar10) {
              local_80 = paVar10->_M_allocated_capacity;
              uStack_78 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
              local_90 = &local_80;
            }
            else {
              local_80 = paVar10->_M_allocated_capacity;
            }
            local_88 = pbVar9->_M_string_length;
            (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar9->_M_string_length = 0;
            (pbVar9->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar8,(string *)&local_90);
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          break;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_70,__rhs);
        _Var13._M_p = (pointer)extraout_RDX;
      }
      if (local_70._M_string_length == 0) {
        lVar11 = 0;
      }
      else {
        sVar15 = 0;
        lVar11 = 0;
        do {
          _Var13._M_p = local_70._M_dataplus._M_p;
          if (9 < (byte)(local_70._M_dataplus._M_p[sVar15] - 0x30U)) break;
          lVar11 = (ulong)((byte)local_70._M_dataplus._M_p[sVar15] & 0xf) + lVar11 * 10;
          sVar15 = sVar15 + 1;
        } while (local_70._M_string_length != sVar15);
      }
      lVar7 = -lVar11;
      if (cVar1 != '-') {
        lVar7 = lVar11;
      }
      dVar17 = (double)lVar7;
    }
    else {
      dVar17 = 0.0;
      puVar6 = puVar16;
      if (puVar16 < _Var13._M_p) {
LAB_0034fe08:
        iVar5 = isspace((int)(char)__c);
        dVar17 = 0.0;
        _Var13._M_p = (pointer)extraout_RDX_00;
        puVar16 = puVar6;
        if ((((iVar5 == 0) && (__c != 0x2c)) && (__c != 0x5d)) && (__c != 0x7d)) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"JSON ERROR: Number: unexpected character \'","");
          std::operator+(&local_50,&local_d0,__c);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,"\'");
          local_90 = (size_type *)(pbVar9->_M_dataplus)._M_p;
          paVar10 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90 == paVar10) {
            local_80 = paVar10->_M_allocated_capacity;
            uStack_78 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_90 = &local_80;
          }
          else {
            local_80 = paVar10->_M_allocated_capacity;
          }
          local_88 = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar8,(string *)&local_90);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
LAB_0034ff21:
    *offset = (size_t)(puVar16 + -1);
    if (bVar3) {
      t_str._M_str = _Var13._M_p;
      t_str._M_len = (size_t)local_b0._M_dataplus._M_p;
      tVar2 = parse_num<double>((chaiscript *)local_b0._M_string_length,t_str);
      dVar17 = pow(10.0,dVar17);
      *(double *)
       &(__return_storage_ptr__->internal).d.
        super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
        .
        super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           = dVar17 * tVar2 * (double)iVar12;
      _Var4 = '\x04';
      goto LAB_00350050;
    }
  }
  else {
    *offset = (size_t)(puVar16 + -1);
    dVar17 = 0.0;
  }
  if (local_70._M_string_length == 0) {
    if ((chaiscript *)local_b0._M_string_length == (chaiscript *)0x0) {
      lVar11 = 0;
    }
    else {
      pcVar14 = (chaiscript *)0x0;
      lVar11 = 0;
      do {
        if (9 < (byte)(local_b0._M_dataplus._M_p[(long)pcVar14] - 0x30U)) break;
        lVar11 = (ulong)((byte)local_b0._M_dataplus._M_p[(long)pcVar14] & 0xf) + lVar11 * 10;
        pcVar14 = pcVar14 + 1;
      } while ((chaiscript *)local_b0._M_string_length != pcVar14);
    }
    *(long *)&(__return_storage_ptr__->internal).d.
              super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
              .
              super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
              .
              super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = lVar11 * iVar12;
    _Var4 = '\x05';
  }
  else {
    if ((chaiscript *)local_b0._M_string_length == (chaiscript *)0x0) {
      dVar18 = 0.0;
    }
    else {
      pcVar14 = (chaiscript *)0x0;
      lVar11 = 0;
      do {
        if (9 < (byte)(local_b0._M_dataplus._M_p[(long)pcVar14] - 0x30U)) break;
        lVar11 = (ulong)((byte)local_b0._M_dataplus._M_p[(long)pcVar14] & 0xf) + lVar11 * 10;
        pcVar14 = pcVar14 + 1;
      } while ((chaiscript *)local_b0._M_string_length != pcVar14);
      dVar18 = (double)lVar11;
    }
    dVar17 = pow(10.0,dVar17);
    *(double *)
     &(__return_storage_ptr__->internal).d.
      super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      .
      super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = dVar17 * dVar18 * (double)iVar12;
    _Var4 = '\x04';
  }
LAB_00350050:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = _Var4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_number(const std::string &str, size_t &offset) {
      std::string val, exp_str;
      char c = '\0';
      bool isDouble = false;
      bool isNegative = false;
      std::int64_t exp = 0;
      bool isExpNegative = false;
      if (offset < str.size() && str.at(offset) == '-') {
        isNegative = true;
        ++offset;
      }
      for (; offset < str.size();) {
        c = str.at(offset++);
        if (c >= '0' && c <= '9') {
          val += c;
        } else if (c == '.' && !isDouble) {
          val += c;
          isDouble = true;
        } else {
          break;
        }
      }
      if (offset < str.size() && (c == 'E' || c == 'e')) {
        c = str.at(offset++);
        if (c == '-') {
          isExpNegative = true;
        } else if (c == '+') {
          // do nothing
        } else {
          --offset;
        }

        for (; offset < str.size();) {
          c = str.at(offset++);
          if (c >= '0' && c <= '9') {
            exp_str += c;
          } else if (!isspace(c) && c != ',' && c != ']' && c != '}') {
            throw std::runtime_error(std::string("JSON ERROR: Number: Expected a number for exponent, found '") + c + "'");
          } else {
            break;
          }
        }
        exp = chaiscript::parse_num<std::int64_t>(exp_str) * (isExpNegative ? -1 : 1);
      } else if (offset < str.size() && (!isspace(c) && c != ',' && c != ']' && c != '}')) {
        throw std::runtime_error(std::string("JSON ERROR: Number: unexpected character '") + c + "'");
      }
      --offset;

      if (isDouble) {
        return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<double>(val) * std::pow(10, exp));
      } else {
        if (!exp_str.empty()) {
          return JSON((isNegative ? -1 : 1) * static_cast<double>(chaiscript::parse_num<std::int64_t>(val)) * std::pow(10, exp));
        } else {
          return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<std::int64_t>(val));
        }
      }
    }